

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_ldm_fillFastTables(ZSTD_matchState_t *ms,void *end)

{
  long in_RDI;
  BYTE *iend;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (*(int *)(in_RDI + 0x118) == 1) {
    ZSTD_fillHashTable((ZSTD_matchState_t *)CONCAT44(1,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8,ZSTD_dtlm_fast,0xa70e6a);
  }
  else if (*(int *)(in_RDI + 0x118) == 2) {
    ZSTD_fillDoubleHashTable
              ((ZSTD_matchState_t *)CONCAT44(2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
               ZSTD_dtlm_fast,0xa70e7f);
  }
  return 0;
}

Assistant:

static size_t ZSTD_ldm_fillFastTables(ZSTD_matchState_t* ms,
                                      void const* end)
{
    const BYTE* const iend = (const BYTE*)end;

    switch(ms->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, ZSTD_dtlm_fast, ZSTD_tfp_forCCtx);
        break;

    case ZSTD_dfast:
#ifndef ZSTD_EXCLUDE_DFAST_BLOCK_COMPRESSOR
        ZSTD_fillDoubleHashTable(ms, iend, ZSTD_dtlm_fast, ZSTD_tfp_forCCtx);
#else
        assert(0); /* shouldn't be called: cparams should've been adjusted. */
#endif
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
    case ZSTD_btlazy2:
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        break;
    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    return 0;
}